

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O3

int32_t zng_deflateSetParams(zng_stream *strm,zng_deflate_param_value *params,size_t count)

{
  zng_deflate_param zVar1;
  internal_state *piVar2;
  undefined1 auVar3 [16];
  zng_deflate_param_value *pzVar4;
  zng_deflate_param_value *pzVar5;
  int iVar6;
  int32_t iVar7;
  int32_t iVar8;
  ulong uVar9;
  zng_deflate_param_value *pzVar10;
  int *piVar11;
  int *piVar12;
  int32_t *piVar13;
  size_t sVar14;
  bool bVar15;
  zng_deflate_param_value *pzVar16;
  zng_deflate_param_value *pzVar17;
  zng_deflate_param_value *pzVar18;
  bool bVar19;
  size_t sVar20;
  zng_deflate_param_value *pzVar21;
  zng_deflate_param_value *pzVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar28;
  long lVar25;
  
  auVar3 = _DAT_0011e950;
  if (count == 0) {
    iVar6 = deflateStateCheck(strm);
    iVar7 = -2;
    if (iVar6 == 0) {
      iVar7 = 0;
    }
  }
  else {
    uVar9 = count + 3 & 0xfffffffffffffffc;
    lVar25 = count - 1;
    auVar23._8_4_ = (int)lVar25;
    auVar23._0_8_ = lVar25;
    auVar23._12_4_ = (int)((ulong)lVar25 >> 0x20);
    piVar13 = &params[3].status;
    auVar23 = auVar23 ^ _DAT_0011e950;
    auVar24 = _DAT_0011e930;
    auVar26 = _DAT_0011e940;
    do {
      auVar27 = auVar26 ^ auVar3;
      iVar6 = auVar23._4_4_;
      if ((bool)(~(auVar27._4_4_ == iVar6 && auVar23._0_4_ < auVar27._0_4_ || iVar6 < auVar27._4_4_)
                & 1)) {
        piVar13[-0x18] = 0;
      }
      if ((auVar27._12_4_ != auVar23._12_4_ || auVar27._8_4_ <= auVar23._8_4_) &&
          auVar27._12_4_ <= auVar23._12_4_) {
        piVar13[-0x10] = 0;
      }
      auVar27 = auVar24 ^ auVar3;
      iVar28 = auVar27._4_4_;
      if (iVar28 <= iVar6 && (iVar28 != iVar6 || auVar27._0_4_ <= auVar23._0_4_)) {
        piVar13[-8] = 0;
        *piVar13 = 0;
      }
      lVar25 = auVar26._8_8_;
      auVar26._0_8_ = auVar26._0_8_ + 4;
      auVar26._8_8_ = lVar25 + 4;
      lVar25 = auVar24._8_8_;
      auVar24._0_8_ = auVar24._0_8_ + 4;
      auVar24._8_8_ = lVar25 + 4;
      piVar13 = piVar13 + 0x20;
      uVar9 = uVar9 - 4;
    } while (uVar9 != 0);
    iVar6 = deflateStateCheck(strm);
    iVar7 = -2;
    if (iVar6 == 0) {
      piVar2 = strm->state;
      sVar14 = 0;
      bVar19 = true;
      bVar15 = false;
      pzVar16 = (zng_deflate_param_value *)0x0;
      pzVar21 = (zng_deflate_param_value *)0x0;
      pzVar18 = (zng_deflate_param_value *)0x0;
      do {
        pzVar10 = params + sVar14;
        sVar20 = sVar14;
LAB_00107278:
        sVar14 = sVar14 + 1;
        zVar1 = pzVar10->param;
        if (zVar1 != Z_DEFLATE_REPRODUCIBLE) {
          pzVar5 = params + sVar20;
          pzVar17 = pzVar10;
          pzVar4 = pzVar18;
          pzVar22 = pzVar21;
          if ((zVar1 == Z_DEFLATE_STRATEGY) ||
             (pzVar5 = pzVar21, pzVar17 = pzVar21, pzVar4 = pzVar10, pzVar22 = pzVar18,
             zVar1 == Z_DEFLATE_LEVEL)) {
            pzVar18 = pzVar4;
            pzVar21 = pzVar17;
            pzVar17 = pzVar16;
            pzVar4 = pzVar16;
            if (pzVar22 != (zng_deflate_param_value *)0x0) goto LAB_00107314;
            goto LAB_001072d0;
          }
          pzVar10->status = -6;
          bVar15 = true;
LAB_001072ee:
          sVar20 = sVar20 + 1;
          pzVar10 = pzVar10 + 1;
          if (sVar14 == count) {
            iVar7 = -6;
            if (!bVar15) {
              iVar7 = 0;
            }
            if (!bVar19) {
              return -5;
            }
            bVar15 = true;
            if (pzVar18 != (zng_deflate_param_value *)0x0 ||
                pzVar21 != (zng_deflate_param_value *)0x0) {
              if (pzVar18 == (zng_deflate_param_value *)0x0) {
                piVar11 = &piVar2->level;
                pzVar10 = (zng_deflate_param_value *)0x0;
              }
              else {
                piVar11 = (int *)pzVar18->buf;
                pzVar10 = pzVar18;
              }
              if (pzVar21 == (zng_deflate_param_value *)0x0) {
                piVar12 = &piVar2->strategy;
              }
              else {
                piVar12 = (int *)pzVar21->buf;
              }
              iVar8 = zng_deflateParams(strm,*piVar11,*piVar12);
              if (iVar8 != 0) {
                if (pzVar18 != (zng_deflate_param_value *)0x0) {
                  pzVar10->status = -2;
                }
                if (pzVar21 != (zng_deflate_param_value *)0x0) {
                  pzVar21->status = -2;
                }
                bVar15 = false;
              }
            }
            if (pzVar16 != (zng_deflate_param_value *)0x0) {
              piVar2->reproducible = *pzVar16->buf;
            }
            if (bVar15) {
              return iVar7;
            }
            return -2;
          }
          goto LAB_00107278;
        }
        pzVar17 = params + sVar20;
        pzVar4 = pzVar10;
        pzVar5 = pzVar21;
        pzVar22 = pzVar16;
        if (pzVar16 == (zng_deflate_param_value *)0x0) {
LAB_001072d0:
          pzVar16 = pzVar4;
          if (pzVar10->size < 4) goto LAB_00107325;
          goto LAB_001072ee;
        }
LAB_00107314:
        pzVar21 = pzVar5;
        pzVar22->status = -5;
        pzVar16 = pzVar17;
LAB_00107325:
        pzVar10->status = -5;
        iVar7 = -5;
        bVar19 = false;
      } while (sVar14 != count);
    }
  }
  return iVar7;
}

Assistant:

int32_t Z_EXPORT zng_deflateSetParams(zng_stream *strm, zng_deflate_param_value *params, size_t count) {
    size_t i;
    deflate_state *s;
    zng_deflate_param_value *new_level = NULL;
    zng_deflate_param_value *new_strategy = NULL;
    zng_deflate_param_value *new_reproducible = NULL;
    int param_buf_error;
    int version_error = 0;
    int buf_error = 0;
    int stream_error = 0;

    /* Initialize the statuses. */
    for (i = 0; i < count; i++)
        params[i].status = Z_OK;

    /* Check whether the stream state is consistent. */
    if (deflateStateCheck(strm))
        return Z_STREAM_ERROR;
    s = strm->state;

    /* Check buffer sizes and detect duplicates. */
    for (i = 0; i < count; i++) {
        switch (params[i].param) {
            case Z_DEFLATE_LEVEL:
                param_buf_error = deflateSetParamPre(&new_level, sizeof(int), &params[i]);
                break;
            case Z_DEFLATE_STRATEGY:
                param_buf_error = deflateSetParamPre(&new_strategy, sizeof(int), &params[i]);
                break;
            case Z_DEFLATE_REPRODUCIBLE:
                param_buf_error = deflateSetParamPre(&new_reproducible, sizeof(int), &params[i]);
                break;
            default:
                params[i].status = Z_VERSION_ERROR;
                version_error = 1;
                param_buf_error = 0;
                break;
        }
        if (param_buf_error) {
            params[i].status = Z_BUF_ERROR;
            buf_error = 1;
        }
    }
    /* Exit early if small buffers or duplicates are detected. */
    if (buf_error)
        return Z_BUF_ERROR;

    /* Apply changes, remember if there were errors. */
    if (new_level != NULL || new_strategy != NULL) {
        int ret = PREFIX(deflateParams)(strm, new_level == NULL ? s->level : *(int *)new_level->buf,
                                        new_strategy == NULL ? s->strategy : *(int *)new_strategy->buf);
        if (ret != Z_OK) {
            if (new_level != NULL)
                new_level->status = Z_STREAM_ERROR;
            if (new_strategy != NULL)
                new_strategy->status = Z_STREAM_ERROR;
            stream_error = 1;
        }
    }
    if (new_reproducible != NULL) {
        int val = *(int *)new_reproducible->buf;
        if (DEFLATE_CAN_SET_REPRODUCIBLE(strm, val)) {
            s->reproducible = val;
        } else {
            new_reproducible->status = Z_STREAM_ERROR;
            stream_error = 1;
        }
    }

    /* Report version errors only if there are no real errors. */
    return stream_error ? Z_STREAM_ERROR : (version_error ? Z_VERSION_ERROR : Z_OK);
}